

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sz_compat.c
# Opt level: O0

int SZ_BufftoBuffCompress(void *dest,size_t *destLen,void *source,size_t sourceLen,SZ_com_t *param)

{
  int iVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  void *dest_00;
  ulong uVar7;
  size_t in_RCX;
  void *in_RDX;
  undefined8 *in_RSI;
  long in_R8;
  int aec_status;
  size_t padding_size;
  size_t padbuf_size;
  size_t scanlines;
  int pixel_size;
  int interleave;
  void *padbuf;
  void *buf;
  int status;
  aec_stream strm;
  int in_stack_00000144;
  undefined4 in_stack_ffffffffffffff3c;
  bool local_ad;
  void *__ptr;
  undefined4 in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff8c;
  int iVar8;
  void *in_stack_ffffffffffffff90;
  int in_stack_ffffffffffffffa0;
  undefined8 local_48;
  int local_40;
  
  iVar8 = *(int *)(in_R8 + 8);
  iVar1 = *(int *)(in_R8 + 0xc);
  iVar2 = *(int *)(in_R8 + 8);
  iVar3 = *(int *)(in_R8 + 8);
  uVar4 = convert_options(in_stack_00000144);
  __ptr = (void *)0x0;
  local_ad = true;
  if (*(int *)(in_R8 + 4) != 0x20) {
    local_ad = *(int *)(in_R8 + 4) == 0x40;
  }
  uVar5 = (uint)local_ad;
  if (uVar5 == 0) {
    local_40 = *(int *)(in_R8 + 4);
    dest_00 = in_RDX;
  }
  else {
    local_40 = 8;
    dest_00 = malloc(in_RCX);
    if (dest_00 == (void *)0x0) {
      iVar8 = -4;
      goto LAB_002e3a81;
    }
    interleave_buffer(dest_00,in_RDX,in_RCX,*(int *)(in_R8 + 4) / 8);
  }
  iVar6 = bits_to_bytes(local_40);
  uVar7 = ((in_RCX / (ulong)(long)iVar6 + (long)*(int *)(in_R8 + 0xc)) - 1) /
          (ulong)(long)*(int *)(in_R8 + 0xc);
  __ptr = malloc((uint)(((iVar1 + iVar2 + -1) / iVar3) * iVar8 * iVar6) * uVar7);
  if (__ptr == (void *)0x0) {
    iVar8 = -4;
  }
  else {
    uVar4 = uVar4 & 8;
    add_padding(in_stack_ffffffffffffff90,
                (void *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
                (size_t)dest_00,(size_t)__ptr,CONCAT44(uVar5,iVar6),(int)(uVar7 >> 0x20),
                in_stack_ffffffffffffffa0);
    iVar8 = aec_buffer_encode((aec_stream *)CONCAT44(in_stack_ffffffffffffff3c,uVar4));
    if (iVar8 == -2) {
      iVar8 = 2;
    }
    *in_RSI = local_48;
  }
LAB_002e3a81:
  if (__ptr != (void *)0x0) {
    free(__ptr);
  }
  if ((uVar5 != 0) && (dest_00 != (void *)0x0)) {
    free(dest_00);
  }
  return iVar8;
}

Assistant:

int SZ_BufftoBuffCompress(void *dest, size_t *destLen,
                          const void *source, size_t sourceLen,
                          SZ_com_t *param)
{
    struct aec_stream strm;
    int status;

    strm.block_size = param->pixels_per_block;
    strm.rsi = (param->pixels_per_scanline + param->pixels_per_block - 1)
        / param->pixels_per_block;
    strm.flags = AEC_NOT_ENFORCE | convert_options(param->options_mask);
    strm.avail_out = *destLen;
    strm.next_out = dest;
    void *buf = 0;
    void *padbuf = 0;

    int interleave = param->bits_per_pixel == 32 || param->bits_per_pixel == 64;
    if (interleave) {
        strm.bits_per_sample = 8;
        buf = malloc(sourceLen);
        if (buf == NULL) {
            status = SZ_MEM_ERROR;
            goto CLEANUP;
        }
        interleave_buffer(buf, source, sourceLen, param->bits_per_pixel / 8);
    } else {
        strm.bits_per_sample = param->bits_per_pixel;
        buf = (void *)source;
    }

    int pixel_size = bits_to_bytes(strm.bits_per_sample);

    size_t scanlines = (sourceLen / pixel_size + param->pixels_per_scanline - 1)
        / param->pixels_per_scanline;
    size_t padbuf_size = strm.rsi * strm.block_size * pixel_size * scanlines;
    padbuf = malloc(padbuf_size);
    if (padbuf == NULL) {
        status = SZ_MEM_ERROR;
        goto CLEANUP;
    }

    size_t padding_size =
        (strm.rsi * strm.block_size - param->pixels_per_scanline)
        * pixel_size;

    add_padding(padbuf, buf, sourceLen,
                param->pixels_per_scanline * pixel_size,
                padding_size, pixel_size,
                strm.flags & AEC_DATA_PREPROCESS);
    strm.next_in = padbuf;
    strm.avail_in = padbuf_size;

    int aec_status = aec_buffer_encode(&strm);
    if (aec_status == AEC_STREAM_ERROR)
        status = SZ_OUTBUFF_FULL;
    else
        status = aec_status;
    *destLen = strm.total_out;

CLEANUP:
    if (padbuf)
        free(padbuf);
    if (interleave && buf)
        free(buf);
    return status;
}